

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SymDiff(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MM<8UL> *mRight)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  undefined8 in_RSI;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_RDI;
  iterator iter;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar4;
  const_iterator in_stack_ffffffffffffffa8;
  _List_const_iterator<GF2::MM<8UL>_> local_50;
  value_type *in_stack_ffffffffffffffb8;
  _List_const_iterator<GF2::MM<8UL>_> in_stack_ffffffffffffffc0;
  _Self local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  iVar2 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin(in_RDI);
  iVar3 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end(in_RDI);
  local_18._M_node =
       (_List_node_base *)
       std::lower_bound<std::_List_iterator<GF2::MM<8ul>>,GF2::MM<8ul>,GF2::MOGrevlex<8ul>>
                 (iVar2._M_node,iVar3._M_node,local_10);
  iVar2 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end(in_RDI);
  bVar1 = std::operator==(&local_18,(_Self *)&stack0xffffffffffffffc8);
  uVar4 = true;
  if (!bVar1) {
    std::_List_iterator<GF2::MM<8UL>_>::operator*((_List_iterator<GF2::MM<8UL>_> *)0x1cbafc);
    uVar4 = WW<8ul>::operator!=((WW<8UL> *)CONCAT17(uVar4,in_stack_ffffffffffffffa0),
                                (WW<8UL> *)in_RDI);
  }
  if ((bool)uVar4 == false) {
    std::_List_const_iterator<GF2::MM<8UL>_>::_List_const_iterator(&local_50,&local_18);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
              ((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffffa8);
  }
  else {
    std::_List_const_iterator<GF2::MM<8UL>_>::_List_const_iterator
              ((_List_const_iterator<GF2::MM<8UL>_> *)&stack0xffffffffffffffc0,&local_18);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::insert
              ((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
               in_stack_ffffffffffffffc0._M_node,(const_iterator)iVar2._M_node,
               in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void SymDiff(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
		else
			erase(iter);
	}